

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall DLevelScript::GetActorProperty(DLevelScript *this,int tid,int property)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  char *str;
  AActor *pAVar4;
  uint uVar5;
  AActor *self;
  AActor **ppAVar6;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  self = (this->activator).field_0.p;
  if (self == (AActor *)0x0) {
LAB_0050e796:
    self = (AActor *)0x0;
  }
  else if (((self->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->activator).field_0.p = (AActor *)0x0;
    goto LAB_0050e796;
  }
  if (tid == 0) {
    if (self == (AActor *)0x0) {
      return 0;
    }
  }
  else {
    self = AActor::TIDHash[tid & 0x7f];
    while( true ) {
      if (self == (AActor *)0x0) {
        return 0;
      }
      if (self->tid == tid) break;
      self = self->inext;
    }
  }
  iVar2 = 0;
  switch(property) {
  case 0:
    return self->health;
  case 1:
    ppAVar6 = (AActor **)self->Speed;
    break;
  case 2:
    iVar2 = (*(self->super_DThinker).super_DObject._vptr_DObject[0x23])(self,0,1);
    return iVar2;
  case 3:
    ppAVar6 = (AActor **)self->Alpha;
    break;
  case 4:
    lVar3 = 0;
    do {
      if (*(uint32 *)((long)LegacyRenderStyles + lVar3) == (self->RenderStyle).AsDWORD) {
        return *(int *)((long)LegacyRenderStyleIndices + lVar3);
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x38);
    return 1;
  case 5:
    lVar3 = (long)(self->SeeSound).super_FSoundID.ID;
    goto LAB_0050ea82;
  case 6:
    lVar3 = (long)(self->AttackSound).super_FSoundID.ID;
    goto LAB_0050ea82;
  case 7:
    lVar3 = (long)(self->PainSound).super_FSoundID.ID;
    goto LAB_0050ea82;
  case 8:
    lVar3 = (long)(self->DeathSound).super_FSoundID.ID;
    goto LAB_0050ea82;
  case 9:
    lVar3 = (long)(self->ActiveSound).super_FSoundID.ID;
LAB_0050ea82:
    if (lVar3 == 0) {
      str = (char *)0x0;
    }
    else {
      str = S_sfx.Array[lVar3].name.Chars;
    }
LAB_0050eb8e:
    iVar2 = ACSStringPool::AddString(&GlobalACSStrings,str);
    return iVar2;
  case 10:
    uVar5 = (self->flags).Value >> 5;
    goto LAB_0050eb1a;
  case 0xb:
    uVar5 = (self->flags2).Value;
    goto LAB_0050e8a4;
  case 0xc:
    bVar1 = DObject::IsKindOf((DObject *)self,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      return 0;
    }
    ppAVar6 = *(AActor ***)&self[1].super_DThinker.super_DObject.ObjectFlags;
    break;
  case 0xd:
    uVar5 = (self->flags5).Value >> 7;
    goto LAB_0050eb1a;
  case 0xe:
    uVar5 = (self->flags4).Value >> 0x1e;
    goto LAB_0050eb1a;
  case 0xf:
    ppAVar6 = (AActor **)self->Gravity;
    break;
  case 0x10:
    uVar5 = (self->flags).Value;
LAB_0050e8a4:
    uVar5 = uVar5 >> 0x1b;
    goto LAB_0050eb1a;
  case 0x11:
    bVar1 = DObject::IsKindOf((DObject *)self,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar1) {
      return *(int *)&self[1].super_DThinker.super_DObject._vptr_DObject;
    }
    iVar2 = AActor::SpawnHealth(self);
    return iVar2;
  case 0x12:
    uVar5 = (self->flags).Value >> 0x11;
    goto LAB_0050eb1a;
  case 0x13:
    uVar5 = (self->flags3).Value >> 0x12;
    goto LAB_0050eb1a;
  case 0x14:
    (*(self->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_14,self);
    iVar2 = ACSStringPool::AddString(&GlobalACSStrings,FName::NameData.NameArray[local_14].Text);
    return iVar2;
  case 0x15:
    str = AActor::GetTag(self,(char *)0x0);
    goto LAB_0050eb8e;
  case 0x16:
    return self->Score;
  case 0x17:
    uVar5 = (self->flags6).Value >> 0x10;
    goto LAB_0050eb1a;
  case 0x18:
    ppAVar6 = (AActor **)self->DamageFactor;
    break;
  case 0x19:
    iVar2 = DoGetMasterTID(self);
    return iVar2;
  case 0x1a:
    pAVar4 = (self->target).field_0.p;
    if (pAVar4 == (AActor *)0x0) {
      return 0;
    }
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->target).field_0.p = (AActor *)0x0;
      return 0;
    }
    goto LAB_0050eb65;
  case 0x1b:
    pAVar4 = (self->tracer).field_0.p;
    if (pAVar4 == (AActor *)0x0) {
      return 0;
    }
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (self->tracer).field_0.p = (AActor *)0x0;
      return 0;
    }
LAB_0050eb65:
    return pAVar4->tid;
  case 0x1c:
    return self->waterlevel;
  case 0x1d:
    ppAVar6 = (AActor **)(self->Scale).X;
    break;
  case 0x1e:
    ppAVar6 = (AActor **)(self->Scale).Y;
    break;
  case 0x1f:
    uVar5 = (self->flags2).Value >> 0x1c;
LAB_0050eb1a:
    return uVar5 & 1;
  case 0x20:
    return self->Mass;
  case 0x21:
    return self->accuracy;
  case 0x22:
    return self->stamina;
  case 0x23:
    ppAVar6 = (AActor **)self->Height;
    break;
  case 0x24:
    ppAVar6 = (AActor **)self->radius;
    break;
  case 0x25:
    return self->reactiontime;
  case 0x26:
    ppAVar6 = (AActor **)self->meleerange;
    break;
  case 0x27:
    bVar1 = DObject::IsKindOf((DObject *)self,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      return 0;
    }
    ppAVar6 = self[1].sprev;
    break;
  case 0x28:
    bVar1 = DObject::IsKindOf((DObject *)self,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      return 0;
    }
    ppAVar6 = (AActor **)self[1].SpriteAngle.Degrees;
    break;
  case 0x29:
    return self->fillcolor;
  case 0x2a:
    ppAVar6 = (AActor **)self->Friction;
    break;
  case 0x2b:
    ppAVar6 = (AActor **)self->DamageMultiply;
    break;
  case 0x2c:
    ppAVar6 = (AActor **)self->MaxStepHeight;
    break;
  case 0x2d:
    ppAVar6 = (AActor **)self->MaxDropOffHeight;
    break;
  case 0x2e:
    str = FName::NameData.NameArray[(self->DamageType).super_FName.Index].Text;
    goto LAB_0050eb8e;
  default:
    goto switchD_0050e7ea_default;
  }
  iVar2 = SUB84((double)ppAVar6 + 103079215104.0,0);
switchD_0050e7ea_default:
  return iVar2;
}

Assistant:

FACSStack::FACSStack()
{
	sp = 0;
	next = head;
	prev = NULL;
	head = this;
}